

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlpperf.c
# Opt level: O0

void print_tlpperf(tlpperf *t)

{
  char *pcVar1;
  in_addr_t *in_RDI;
  
  printf("============ tlpperf ============\n");
  pcVar1 = inet_ntoa((in_addr)*in_RDI);
  printf("-r remote:              %s\n",pcVar1);
  pcVar1 = inet_ntoa((in_addr)in_RDI[1]);
  printf("-l local:               %s\n",pcVar1);
  printf("-b requester:           %02x:%02x\n",(ulong)(uint)((int)((ushort)in_RDI[2] & 0xff00) >> 8)
         ,(ulong)((ushort)in_RDI[2] & 0xff));
  printf("\n");
  printf("-d direction:           %s\n",direction_str[(int)in_RDI[3]]);
  printf("-a DMA region:          %#lx\n",*(undefined8 *)(in_RDI + 4));
  printf("-s DMA region size:     %lu\n",*(undefined8 *)(in_RDI + 6));
  printf("-L DMA length           %lu\n",*(undefined8 *)(in_RDI + 8));
  printf("\n");
  printf("-N nthreads:            %d\n",(ulong)in_RDI[10]);
  printf("-R how to split:        %s\n",split_str[(int)in_RDI[0xb]]);
  printf("-P pattern:             %s\n",pattern_str[(int)in_RDI[0xc]]);
  pcVar1 = "off";
  if (in_RDI[0xd] != 0) {
    pcVar1 = "on";
  }
  printf("-M latency mode:        %s\n",pcVar1);
  printf("\n");
  printf("-c count:               %d\n",(ulong)in_RDI[0xe]);
  printf("-i interval:            %d\n",(ulong)in_RDI[0xf]);
  printf("-t duration             %d\n",(ulong)in_RDI[0x10]);
  pcVar1 = "off";
  if (debug != 0) {
    pcVar1 = "on";
  }
  printf("-D debug:               %s\n",pcVar1);
  printf("=================================\n");
  return;
}

Assistant:

void print_tlpperf(struct tlpperf *t)
{
	printf("============ tlpperf ============\n");
	printf("-r remote:              %s\n", inet_ntoa(t->remote));
	printf("-l local:               %s\n", inet_ntoa(t->local));
	printf("-b requester:           %02x:%02x\n",
	       (t->requester & 0xFF00) >> 8, t->requester & 0x00FF);

	printf("\n");
	printf("-d direction:           %s\n", direction_str[t->direction]);
	printf("-a DMA region:          %#lx\n", t->region_addr);
	printf("-s DMA region size:     %lu\n", t->region_size);
	printf("-L DMA length           %lu\n", t->dma_len);

	printf("\n");
	printf("-N nthreads:            %d\n", t->nthreads);
	printf("-R how to split:        %s\n", split_str[t->split]);
	printf("-P pattern:             %s\n", pattern_str[t->pattern]);
	printf("-M latency mode:        %s\n", t->latency_mode ? "on" : "off");

	printf("\n");
	printf("-c count:               %d\n", t->count);
	printf("-i interval:            %d\n", t->interval);
	printf("-t duration             %d\n", t->duration);
	printf("-D debug:               %s\n", debug ? "on" : "off");

	printf("=================================\n");
}